

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::adoptImplicitArraySizes(TType *this,bool skipNonvariablyIndexed)

{
  TType *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var;
  int local_1c;
  int i;
  int lastMember;
  bool skipNonvariablyIndexed_local;
  TType *this_local;
  
  uVar2 = (*this->_vptr_TType[0x1f])();
  if (((uVar2 & 1) != 0) &&
     ((((uint)(*(ulong *)&(this->qualifier).field_0x8 >> 7) & 0x1ff) == 0x47 ||
      ((!skipNonvariablyIndexed && (uVar2 = (*this->_vptr_TType[0x21])(), (uVar2 & 1) == 0)))))) {
    iVar3 = (*this->_vptr_TType[0x12])();
    changeOuterArraySize(this,iVar3);
    (*this->_vptr_TType[0x24])(this,1);
  }
  bVar1 = TQualifier::isPerView(&this->qualifier);
  if (((bVar1) && (this->arraySizes != (TArraySizes *)0x0)) &&
     (bVar1 = TArraySizes::isInnerUnsized(this->arraySizes), bVar1)) {
    TArraySizes::clearInnerUnsized(this->arraySizes);
  }
  uVar2 = (*this->_vptr_TType[0x25])();
  if (((uVar2 & 1) != 0) &&
     (sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&((this->field_13).structure)->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), sVar4 != 0)) {
    sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&((this->field_13).structure)->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    iVar3 = (int)sVar4 + -1;
    for (local_1c = 0; local_1c < iVar3; local_1c = local_1c + 1) {
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&((this->field_13).structure)->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(long)local_1c);
      adoptImplicitArraySizes(pvVar5->type,false);
    }
    pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&((this->field_13).structure)->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(long)iVar3);
    this_00 = pvVar5->type;
    iVar3 = (*this->_vptr_TType[10])();
    adoptImplicitArraySizes
              (this_00,((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar3) + 8) & 0x7f) == 6);
  }
  return;
}

Assistant:

void adoptImplicitArraySizes(bool skipNonvariablyIndexed)
    {
        if (isUnsizedArray() &&
            (qualifier.builtIn == EbvSampleMask ||
                !(skipNonvariablyIndexed || isArrayVariablyIndexed()))) {
            changeOuterArraySize(getImplicitArraySize());
            setImplicitlySized(true);
        }
        // For multi-dim per-view arrays, set unsized inner dimension size to 1
        if (qualifier.isPerView() && arraySizes && arraySizes->isInnerUnsized())
            arraySizes->clearInnerUnsized();
        if (isStruct() && structure->size() > 0) {
            int lastMember = (int)structure->size() - 1;
            for (int i = 0; i < lastMember; ++i)
                (*structure)[i].type->adoptImplicitArraySizes(false);
            // implement the "last member of an SSBO" policy
            (*structure)[lastMember].type->adoptImplicitArraySizes(getQualifier().storage == EvqBuffer);
        }
    }